

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ImplicitWeakMessage::New(ImplicitWeakMessage *this)

{
  ImplicitWeakMessage *this_00;
  ImplicitWeakMessage *this_local;
  
  this_00 = (ImplicitWeakMessage *)operator_new(0x30);
  ImplicitWeakMessage(this_00);
  return &this_00->super_MessageLite;
}

Assistant:

MessageLite* New() const override { return new ImplicitWeakMessage; }